

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseAllSettledResolveOrRejectElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper,
          bool isRejecting)

{
  ScriptContext *scriptContext;
  DynamicObject *prototype;
  JavascriptMethod entryPoint_00;
  ScriptContext **ppSVar1;
  DynamicObject **ppDVar2;
  DynamicTypeHandler *typeHandler;
  Recycler *pRVar3;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *this_00;
  Var pvVar4;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_81;
  TrackAllocData local_80;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *local_58;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *function;
  DynamicType *type;
  FunctionInfo *functionInfo;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJStack_38;
  bool isRejecting_local;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements_local;
  JavascriptPromiseCapability *capabilities_local;
  JavascriptArray *values_local;
  JavascriptMethod p_Stack_18;
  uint32 index_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo._7_1_ = isRejecting;
  type = (DynamicType *)JavascriptPromise::EntryInfo::AllSettledResolveOrRejectElementFunction;
  pJStack_38 = remainingElements;
  remainingElements_local =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)capabilities;
  capabilities_local = (JavascriptPromiseCapability *)values;
  values_local._4_4_ = index;
  p_Stack_18 = entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = p_Stack_18;
  prototype = *ppDVar2;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  function = (JavascriptPromiseAllSettledResolveOrRejectElementFunction *)
             DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                              entryPoint_00,typeHandler,false,false);
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,
             (type_info *)&JavascriptPromiseAllSettledResolveOrRejectElementFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a11);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_80);
  this_00 = (JavascriptPromiseAllSettledResolveOrRejectElementFunction *)
            new<(Memory::ObjectInfoBits)1>(0x78,pRVar3,&local_81);
  JavascriptPromiseAllSettledResolveOrRejectElementFunction::
  JavascriptPromiseAllSettledResolveOrRejectElementFunction
            (this_00,(DynamicType *)function,(FunctionInfo *)type,values_local._4_4_,
             (JavascriptArray *)capabilities_local,
             (JavascriptPromiseCapability *)remainingElements_local,pJStack_38,alreadyCalledWrapper,
             (bool)(functionInfo._7_1_ & 1));
  local_58 = this_00;
  pvVar4 = TaggedInt::ToVarUnchecked(1);
  (**(code **)((long)(this_00->super_JavascriptPromiseAllResolveElementFunction).
                     super_RuntimeFunction.super_JavascriptFunction.super_DynamicObject.
                     super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject +
              0xf0))(this_00,0xd1,pvVar4,2,0,0,0xf);
  return local_58;
}

Assistant:

JavascriptPromiseAllSettledResolveOrRejectElementFunction* JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper, bool isRejecting)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AllSettledResolveOrRejectElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAllSettledResolveOrRejectElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAllSettledResolveOrRejectElementFunction, type, functionInfo, index, values, capabilities, remainingElements, alreadyCalledWrapper, isRejecting);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }